

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

ssize_t __thiscall
asmjit::v1_14::JitAllocator::write(JitAllocator *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  long lVar1;
  ulong in_R8;
  int in_R9D;
  ProtectJitReadWriteScope writeScope;
  CachePolicy in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar2;
  void *in_stack_ffffffffffffff88;
  ProtectJitReadWriteScope *in_stack_ffffffffffffff90;
  undefined4 local_2c;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  uVar2 = true;
  if (*(long *)(lVar1 + 0x18) != 0) {
    uVar2 = true;
    if (__buf <= *(void **)(lVar1 + 0x10)) {
      uVar2 = (ulong)(*(long *)(lVar1 + 0x10) - (long)__buf) < in_R8;
    }
  }
  if ((bool)uVar2 == false) {
    if (in_R8 == 0) {
      local_2c = 0;
    }
    else {
      if (in_R9D == 0) {
        JitAllocator_defaultPolicyForSpan((Span *)0x145dfd);
      }
      VirtMem::ProtectJitReadWriteScope::ProtectJitReadWriteScope
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 CONCAT17(uVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c);
      memcpy((void *)(*(long *)(lVar1 + 8) + (long)__buf),(void *)__n,in_R8);
      local_2c = 0;
      VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope
                ((ProtectJitReadWriteScope *)CONCAT17(uVar2,in_stack_ffffffffffffff80));
    }
  }
  else {
    local_2c = DebugUtils::errored(2);
  }
  return (ulong)local_2c;
}

Assistant:

Error JitAllocator::write(Span& span, size_t offset, const void* src, size_t size, VirtMem::CachePolicy policy) noexcept {
  if (ASMJIT_UNLIKELY(span._block == nullptr || offset > span.size() || span.size() - offset < size))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(size == 0))
    return kErrorOk;

  if (policy == VirtMem::CachePolicy::kDefault)
    policy = JitAllocator_defaultPolicyForSpan(span);

  VirtMem::ProtectJitReadWriteScope writeScope(span.rx(), span.size(), policy);
  memcpy(static_cast<uint8_t*>(span.rw()) + offset, src, size);
  return kErrorOk;
}